

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O2

void nni_posix_pollq_sysfini(void)

{
  nni_posix_pollq *pnVar1;
  ulong uVar2;
  ssize_t sVar3;
  int i;
  long lVar4;
  nni_mtx *mtx;
  long lVar5;
  ulong local_38;
  
  uVar2 = (ulong)(uint)nni_epoll_npq;
  if (0 < nni_epoll_npq) {
    lVar5 = 0x70;
    lVar4 = 0;
    local_38 = uVar2;
    while( true ) {
      pnVar1 = nni_epoll_pqs;
      if ((int)uVar2 <= lVar4) break;
      local_38 = 1;
      if (*(char *)((long)nni_epoll_pqs + lVar5 + -7) == '\x01') {
        mtx = (nni_mtx *)((long)nni_epoll_pqs + lVar5 + -0x70);
        nni_mtx_lock(mtx);
        *(undefined1 *)((long)pnVar1 + lVar5 + -8) = 1;
        sVar3 = write(*(int *)((long)pnVar1 + lVar5 + -0xc),&local_38,8);
        if (sVar3 != 8) {
          nni_panic("BUG! unable to write to evfd!");
        }
        nni_mtx_unlock(mtx);
        nni_thr_fini((nni_thr *)((long)&(pnVar1->mtx).mtx + lVar5));
        close(*(int *)((long)pnVar1 + lVar5 + -0xc));
        close(*(int *)((long)pnVar1 + lVar5 + -0x10));
        nni_mtx_fini(mtx);
        uVar2 = (ulong)(uint)nni_epoll_npq;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x120;
    }
    nni_free(nni_epoll_pqs,(long)(int)uVar2 * 0x120);
    nni_epoll_pqs = (nni_posix_pollq *)0x0;
    nni_epoll_npq = 0;
  }
  return;
}

Assistant:

void
nni_posix_pollq_sysfini(void)
{
	if (nni_epoll_npq > 0) {
		for (int i = 0; i < nni_epoll_npq; i++) {
			nni_epoll_pq_destroy(&nni_epoll_pqs[i]);
		}
		NNI_FREE_STRUCTS(nni_epoll_pqs, nni_epoll_npq);
		nni_epoll_pqs = NULL;
		nni_epoll_npq = 0;
	}
}